

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void FreeLevel(Level *lvl)

{
  void *in_RDI;
  void *Next;
  QuadTreeNode *in_stack_fffffffffffffff0;
  undefined8 uVar1;
  
  if (in_RDI != (void *)0x0) {
    FreeQuadTree(in_stack_fffffffffffffff0);
    FreeQuadTree(in_stack_fffffffffffffff0);
    while (*(long *)((long)in_RDI + 0xf8) != 0) {
      uVar1 = *(undefined8 *)(*(long *)((long)in_RDI + 0xf8) + 0x28);
      free(*(void **)((long)in_RDI + 0xf8));
      *(undefined8 *)((long)in_RDI + 0xf8) = uVar1;
    }
    while (*(long *)((long)in_RDI + 0xf0) != 0) {
      uVar1 = *(undefined8 *)(*(long *)((long)in_RDI + 0xf0) + 0x28);
      free(*(void **)((long)in_RDI + 0xf0));
      *(undefined8 *)((long)in_RDI + 0xf0) = uVar1;
    }
    while (*(long *)((long)in_RDI + 0xe0) != 0) {
      uVar1 = *(undefined8 *)(*(long *)((long)in_RDI + 0xe0) + 0x18);
      free(*(void **)((long)in_RDI + 0xe0));
      *(undefined8 *)((long)in_RDI + 0xe0) = uVar1;
    }
    while (*(long *)((long)in_RDI + 0xb8) != 0) {
      uVar1 = *(undefined8 *)(*(long *)((long)in_RDI + 0xb8) + 0x18);
      free(*(void **)((long)in_RDI + 0xb8));
      *(undefined8 *)((long)in_RDI + 0xb8) = uVar1;
    }
    while (*(long *)((long)in_RDI + 0xe8) != 0) {
      uVar1 = *(undefined8 *)(*(long *)((long)in_RDI + 0xe8) + 0x30);
      free(*(void **)((long)in_RDI + 0xe8));
      *(undefined8 *)((long)in_RDI + 0xe8) = uVar1;
    }
    while (*(long *)((long)in_RDI + 0x100) != 0) {
      uVar1 = *(undefined8 *)(*(long *)((long)in_RDI + 0x100) + 0x50);
      free(*(void **)((long)in_RDI + 0x100));
      *(undefined8 *)((long)in_RDI + 0x100) = uVar1;
    }
    FreeState((LevelState *)0x10f479);
    free(in_RDI);
  }
  return;
}

Assistant:

void FreeLevel(struct Level *lvl)
{
   void *Next;

   if (!lvl)
      return;

   /* easy things first */
   FreeQuadTree(&lvl->DisplayTree);
   FreeQuadTree(&lvl->CollisionTree);

   /* free the resource lists */
   FreeList(AllTris, Triangle, NoAction);
   FreeList(AllEdges, Edge, NoAction);

   FreeList(AllMats, Material, NoAction);
   FreeList(AllObjectTypes, ObjectType, NoAction);

   FreeList(AllVerts, Vertex, NoAction);
   FreeList(AllObjects, Object, NoAction);

   /* finally, free the level structure itself */
   FreeState(lvl->InitialState);
   free(lvl);
}